

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestParser.cpp
# Opt level: O3

void __thiscall UnitTest_parser21::Run(UnitTest_parser21 *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *local_40;
  string local_38;
  
  paVar1 = &local_38.field_2;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"t = {} t.a = ","");
  io::text::InStringStream::SetInputString
            ((InStringStream *)(anonymous_namespace)::g_parser,&local_38);
  luna::Parse((luna *)&local_40,(Lexer *)((anonymous_namespace)::g_parser + 0xd0));
  if (local_40 != (long *)0x0) {
    (**(code **)(*local_40 + 8))();
  }
  local_40 = (long *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"\'{ Parse(\"t = {} t.a = \"); }\' has no luna::ParseException","")
  ;
  UnitTestBase::Error(&this->super_UnitTestBase,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST_CASE(parser21)
{
    EXPECT_EXCEPTION(luna::ParseException,
                     {
                         Parse("t = {} t.a = ");
                     });
}